

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptNativeFloatArray *
Js::JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)

{
  Type *addr;
  Type *pTVar1;
  ScriptContext *pSVar2;
  InterruptPoller *pIVar3;
  Recycler *recycler;
  Type nextSeg;
  DynamicType *pDVar4;
  JavascriptLibrary *pJVar5;
  DynamicTypeHandler *pDVar6;
  FinalizableObject FVar7;
  code *pcVar8;
  ThreadContext *pTVar9;
  bool bVar10;
  DynamicObjectFlags DVar11;
  BOOL BVar12;
  uint sourceContextId;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ArrayCallSiteInfo *this;
  undefined4 *puVar16;
  FunctionBody *pFVar17;
  FunctionInfo *pFVar18;
  Type current;
  SegmentBTreeRoot *this_00;
  long lVar19;
  long lVar20;
  INT_PTR *pIVar21;
  Type *pTVar22;
  Type this_01;
  double dVar23;
  undefined1 local_130 [8];
  AutoDisableInterrupt failFastError;
  JavascriptFunction *local_60;
  JavascriptFunction *caller;
  uint32 local_4c;
  Type local_48;
  ThreadContext *local_40;
  bool local_31;
  
  pSVar2 = (((((intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  local_40 = pSVar2->threadContext;
  local_31 = local_40->noJsReentrancy;
  local_40->noJsReentrancy = true;
  this = JavascriptNativeArray::GetArrayCallSiteInfo(&intArray->super_JavascriptNativeArray);
  addr = &(intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
          super_DynamicObject.super_RecyclableObject.type;
  if (this != (ArrayCallSiteInfo *)0x0) {
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_130,
               (((addr->ptr->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
               ,true,(PVOID)0x0,false);
    local_60 = (JavascriptFunction *)0x0;
    do {
      BVar12 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_130,&local_60,true);
      if (BVar12 == 0) {
        bVar10 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase);
        if (!bVar10) goto LAB_00b6e586;
        Output::Print(L"Conversion: Int array to Float array across ScriptContexts");
        goto LAB_00b6e581;
      }
    } while ((local_60 == (JavascriptFunction *)0x0) ||
            (BVar12 = JavascriptFunction::IsScriptFunction(local_60), BVar12 == 0));
    if (local_60 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                   ,0x68d,"(caller)","caller");
      if (!bVar10) goto LAB_00b6eac7;
      *puVar16 = 0;
    }
    pFVar17 = JavascriptFunction::GetFunctionBody(local_60);
    if (pFVar17 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                   ,0x68e,"(caller->GetFunctionBody())","caller->GetFunctionBody()")
      ;
      if (!bVar10) goto LAB_00b6eac7;
      *puVar16 = 0;
    }
    pFVar17 = JavascriptFunction::GetFunctionBody(local_60);
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar17);
    pFVar17 = JavascriptFunction::GetFunctionBody(local_60);
    pFVar18 = (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar18 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar10) goto LAB_00b6eac7;
      *puVar16 = 0;
      pFVar18 = (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar10 = Phases::IsEnabled((Phases *)&DAT_015b6718,NativeArrayConversionPhase,sourceContextId,
                               pFVar18->functionId);
    if (bVar10) {
      Output::Print(L"Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"
                    ,(ulong)this->functionNumber,(ulong)this->callSiteNumber);
LAB_00b6e581:
      Output::Flush();
    }
LAB_00b6e586:
    ArrayCallSiteInfo::SetIsNotNativeIntArray(this);
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_130);
  }
  local_130 = (undefined1  [8])pSVar2->threadContext;
  failFastError.m_threadContext._0_2_ = 0;
  failFastError.m_threadContext._2_1_ = 1;
  pIVar3 = ((ThreadContext *)local_130)->interruptPoller;
  if (pIVar3 != (InterruptPoller *)0x0) {
    failFastError.m_threadContext._0_2_ = (ushort)pIVar3->isDisabled << 8;
    pIVar3->isDisabled = true;
  }
  this_01 = (Type)(intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  if (this_01 != (Type)0x0) {
    recycler = pSVar2->recycler;
    caller = (JavascriptFunction *)__tls_get_addr(&PTR_01548f08);
    pTVar1 = &(intArray->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
    local_48 = (Type)0x0;
    do {
      nextSeg = *(Type *)((long)this_01 + 0x10);
      current = local_48;
      if (*(uint *)((long)this_01 + 8) != 0) {
        local_4c = *(uint32 *)this_01;
        uVar14 = *(uint *)((long)this_01 + 4);
        if ((this_01 == (Type)(intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr
            ) || (uVar13 = *(uint *)((long)this_01 + 8) >> 2, uVar13 < uVar14)) {
          bVar10 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
          if (nextSeg == (Type)0x0 && !bVar10) {
            current = (Type)SparseArraySegment<double>::AllocateSegmentImpl<true>
                                      (recycler,local_4c,uVar14,(SparseArraySegmentBase *)0x0);
          }
          else {
            current = (Type)SparseArraySegment<double>::AllocateSegmentImpl<false>
                                      (recycler,local_4c,uVar14,(SparseArraySegmentBase *)nextSeg);
          }
          if (current == (Type)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)
             &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                         ,0x6c5,"(newSeg != nullptr)","newSeg != nullptr");
            if (!bVar10) goto LAB_00b6eac7;
            *(undefined4 *)
             &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
          }
          if ((this_01 !=
              (Type)(intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) ==
              (local_48 == (Type)0x0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)
             &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
            bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                         ,0x6c6,"((prevSeg == nullptr) == (seg == intArray->head))",
                                         "(prevSeg == nullptr) == (seg == intArray->head)");
            if (!bVar10) goto LAB_00b6eac7;
            *(undefined4 *)
             &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
          }
          pTVar22 = (Type *)((long)current + 0x10);
          Memory::Recycler::WBSetBit((char *)pTVar22);
          *pTVar22 = nextSeg;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar22);
          if (((local_48 == (Type)0x0) || (*(long *)((long)local_48 + 0x10) != 0)) ||
             (bVar10 = SparseArraySegmentBase::IsLeafSegment
                                 ((SparseArraySegmentBase *)local_48,
                                  ((((addr->ptr->javascriptLibrary).ptr)->
                                   super_JavascriptLibraryBase).scriptContext.ptr)->recycler),
             !bVar10)) {
            JavascriptArray::LinkSegmentsCommon
                      ((JavascriptArray *)intArray,(SparseArraySegmentBase *)local_48,
                       (SparseArraySegmentBase *)current);
          }
          else {
            JavascriptArray::ReallocNonLeafSegment<double>
                      ((JavascriptArray *)intArray,(SparseArraySegment<double> *)local_48,
                       (SparseArraySegmentBase *)current,false);
          }
          DVar11 = DynamicObject::GetArrayFlags((DynamicObject *)intArray);
          pTVar22 = (Type *)((long)*pTVar1 + 0x20);
          if ((DVar11 & HasSegmentMap) == None) {
            pTVar22 = pTVar1;
          }
          if (*pTVar22 == this_01) {
            JavascriptArray::SetLastUsedSegment
                      ((JavascriptArray *)intArray,(SparseArraySegmentBase *)current);
          }
          this_00 = JavascriptArray::GetSegmentMap((JavascriptArray *)intArray);
          if (this_00 != (SegmentBTreeRoot *)0x0) {
            SegmentBTree::SwapSegment
                      (&this_00->super_SegmentBTree,local_4c,(SparseArraySegmentBase *)this_01,
                       (SparseArraySegmentBase *)current);
          }
          uVar14 = *(Type *)((long)current + 4);
          if (uVar14 != 0) {
            uVar13 = 0;
            do {
              iVar15 = *(int *)((long)this_01 + 0x18 + (long)(int)uVar13 * 4);
              if (iVar15 == -0x7fffe) {
                if (current ==
                    (Type)(intArray->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) {
                  DVar11 = DynamicObject::GetArrayFlags((DynamicObject *)intArray);
                  if ((DVar11 & HasNoMissingValues) != None) {
                    if ((current ==
                         (Type)(intArray->super_JavascriptNativeArray).super_JavascriptArray.head.
                               ptr) &&
                       (DVar11 = DynamicObject::GetArrayFlags((DynamicObject *)intArray),
                       (DVar11 & HasNoMissingValues) != None)) {
                      AssertCount = AssertCount + 1;
                      Throw::LogAssert();
                      *(undefined4 *)
                       &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
                        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
                      bVar10 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                                  ,0x6da,
                                                  "((newSeg != intArray->head || !intArray->HasNoMissingValues()))"
                                                  ,"Unexpected missing item during array conversion"
                                                  );
                      if (!bVar10) goto LAB_00b6eac7;
                      *(undefined4 *)
                       &(caller->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
                        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
                    }
                    Throw::FatalInternalError(-0x7fffbffb);
                  }
                  uVar14 = *(Type *)((long)current + 4);
                }
              }
              else {
                *(double *)
                 (&((SparseArraySegmentBase *)((long)current + 0x18))->left + (long)(int)uVar13 * 2)
                     = (double)iVar15;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < uVar14);
          }
        }
        else {
          *(uint *)((long)this_01 + 8) = uVar13;
          SparseArraySegmentBase::CheckLengthvsSize((SparseArraySegmentBase *)this_01);
          uVar14 = *(int *)((long)this_01 + 4) - 1;
          current = this_01;
          if (-1 < (int)uVar14) {
            lVar19 = (ulong)uVar14 + 3;
            do {
              iVar15 = *(int *)((long)this_01 + 0xc + lVar19 * 4);
              dVar23 = JavascriptNativeFloatArray::MissingItem;
              if (iVar15 != -0x7fffe) {
                dVar23 = (double)iVar15;
              }
              *(double *)((long)this_01 + lVar19 * 8) = dVar23;
              lVar20 = lVar19 + -3;
              bVar10 = lVar19 != 3;
              lVar19 = lVar19 + -1;
            } while (bVar10 && -1 < lVar20);
          }
        }
      }
      local_48 = current;
      this_01 = nextSeg;
    } while (nextSeg != (Type)0x0);
  }
  pDVar4 = (DynamicType *)addr->ptr;
  pJVar5 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  if (pDVar4 == (pJVar5->nativeIntArrayType).ptr) {
    pDVar4 = (pJVar5->nativeFloatArrayType).ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = &pDVar4->super_Type;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    if (pDVar4->isLocked == true) {
      pDVar6 = (pDVar4->typeHandler).ptr;
      iVar15 = (*pDVar6->_vptr_DynamicTypeHandler[0x4e])(pDVar6);
      if (iVar15 == 0) {
        DynamicObject::ChangeType((DynamicObject *)intArray);
      }
      else {
        (*pDVar6->_vptr_DynamicTypeHandler[0x4a])(pDVar6,intArray);
      }
    }
    addr->ptr->typeId = TypeIds_ArrayLast;
  }
  BVar12 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptNativeIntArray>(intArray);
  FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject;
  if (BVar12 == 0) {
    if (FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
        (IRecyclerVisitedObject)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address) {
      pIVar21 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
      goto LAB_00b6ea2c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                 ,0x716,
                                 "(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray))"
                                 ,
                                 "VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray)"
                                );
    if (!bVar10) goto LAB_00b6eac7;
    pIVar21 = &VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
  }
  else {
    if (FVar7.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject ==
        (IRecyclerVisitedObject)
        VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address) {
      pIVar21 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
      goto LAB_00b6ea2c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                 ,0x711,
                                 "(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray))"
                                 ,
                                 "VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray)"
                                );
    if (!bVar10) {
LAB_00b6eac7:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    pIVar21 = &VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address;
  }
  *puVar16 = 0;
LAB_00b6ea2c:
  pTVar9 = local_40;
  (intArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
  super_DynamicObject.super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)((IRecyclerVisitedObject *)pIVar21)->_vptr_IRecyclerVisitedObject;
  failFastError.m_threadContext._0_1_ = 1;
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_130);
  pTVar9->noJsReentrancy = local_31;
  return (JavascriptNativeFloatArray *)intArray;
}

Assistant:

JavascriptNativeFloatArray *JavascriptNativeIntArray::ToNativeFloatArray(JavascriptNativeIntArray *intArray)
    {
        ScriptContext *scriptContext = intArray->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(IntArr_ToNativeFloatArray, reentrancylock, scriptContext->GetThreadContext());
#if ENABLE_PROFILE_INFO
        ArrayCallSiteInfo *arrayInfo = intArray->GetArrayCallSiteInfo();
        if (arrayInfo)
        {
#if DBG
            Js::JavascriptStackWalker walker(intArray->GetScriptContext());
            Js::JavascriptFunction* caller = nullptr;
            bool foundScriptCaller = false;
            while(walker.GetCaller(&caller))
            {
                if(caller != nullptr && Js::ScriptFunction::Test(caller))
                {
                    foundScriptCaller = true;
                    break;
                }
            }

            if(foundScriptCaller)
            {
                Assert(caller);
                Assert(caller->GetFunctionBody());
                if(PHASE_TRACE(Js::NativeArrayConversionPhase, caller->GetFunctionBody()))
                {
                    Output::Print(_u("Conversion: Int array to Float array    ArrayCreationFunctionNumber:%2d    CallSiteNumber:%2d \n"), arrayInfo->functionNumber, arrayInfo->callSiteNumber);
                    Output::Flush();
                }
            }
            else
            {
                if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
                {
                    Output::Print(_u("Conversion: Int array to Float array across ScriptContexts"));
                    Output::Flush();
                }
            }
#else
            if(PHASE_TRACE1(Js::NativeArrayConversionPhase))
            {
                Output::Print(_u("Conversion: Int array to Float array"));
                Output::Flush();
            }
#endif

            arrayInfo->SetIsNotNativeIntArray();
        }
#endif


        // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
        AutoDisableInterrupt failFastError(scriptContext->GetThreadContext());

        // Grow the segments
        Recycler *recycler = scriptContext->GetRecycler();
        SparseArraySegmentBase *seg, *nextSeg, *prevSeg = nullptr;
        for (seg = intArray->head; seg; seg = nextSeg)
        {
            nextSeg = seg->next;
            uint32 size = seg->size;
            if (size == 0)
            {
                continue;
            }

            uint32 left = seg->left;
            uint32 length = seg->length;
            int i;
            int32 ival;

            // The old segment will have size/2 and length capped by the new size.
            uint32 newSegSize = seg->size >> 1;
            if (seg == intArray->head || seg->length > (newSegSize >> 1))
            {
                // Some live elements are being pushed out of this segment, so allocate a new one.
                SparseArraySegment<double> *newSeg =
                    SparseArraySegment<double>::AllocateSegment(recycler, left, length, nextSeg);
                Assert(newSeg != nullptr);
                Assert((prevSeg == nullptr) == (seg == intArray->head));
                newSeg->next = nextSeg;
                intArray->LinkSegments((SparseArraySegment<double>*)prevSeg, newSeg);
                if (intArray->GetLastUsedSegment() == seg)
                {
                    intArray->SetLastUsedSegment(newSeg);
                }
                prevSeg = newSeg;
                SegmentBTree * segmentMap = intArray->GetSegmentMap();
                if (segmentMap)
                {
                    segmentMap->SwapSegment(left, seg, newSeg);
                }

                // Fill the new segment with the overflow.
                for (i = 0; (uint)i < newSeg->length; i++)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i /*+ seg->length*/];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        AssertMsgAndFailFast(newSeg != intArray->head || !intArray->HasNoMissingValues(), "Unexpected missing item during array conversion");
                        continue;
                    }
                    newSeg->elements[i] = (double)ival;
                }
            }
            else
            {
                seg->size = newSegSize >> 1;
                seg->CheckLengthvsSize();

                // Now convert the contents that will remain in the old segment.
                for (i = seg->length - 1; i >= 0; i--)
                {
                    ival = ((SparseArraySegment<int32>*)seg)->elements[i];
                    if (ival == JavascriptNativeIntArray::MissingItem)
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)JavascriptNativeFloatArray::MissingItem;
                    }
                    else
                    {
                        ((SparseArraySegment<double>*)seg)->elements[i] = (double)ival;
                    }
                }
                prevSeg = seg;
            }
        }

        if (intArray->GetType() == scriptContext->GetLibrary()->GetNativeIntArrayType())
        {
            intArray->type = scriptContext->GetLibrary()->GetNativeFloatArrayType();
        }
        else
        {
            if (intArray->GetDynamicType()->GetIsLocked())
            {
                DynamicTypeHandler *typeHandler = intArray->GetDynamicType()->GetTypeHandler();
                if (typeHandler->IsPathTypeHandler())
                {
                    // We can't allow a type with the new type ID to be promoted to the old type.
                    // So go to a dictionary type handler, which will orphan the new type.
                    // This should be a corner case, so the inability to share the new type is unlikely to matter.
                    // If it does matter, try building a path from the new type's built-in root.
                    static_cast<PathTypeHandlerBase*>(typeHandler)->ResetTypeHandler(intArray);
                }
                else
                {
                    intArray->ChangeType();
                }
            }
            intArray->GetType()->SetTypeId(TypeIds_NativeFloatArray);
        }

        if (CrossSite::IsCrossSiteObjectTyped(intArray))
        {
            Assert(VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(intArray));
            VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::SetVirtualTable(intArray);
        }
        else
        {
            Assert(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(intArray));
            VirtualTableInfo<JavascriptNativeFloatArray>::SetVirtualTable(intArray);
        }

        failFastError.Completed();
        return (JavascriptNativeFloatArray*)intArray;
        JIT_HELPER_END(IntArr_ToNativeFloatArray);
    }